

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::CheckIncompleteResult<vk::VkLayerProperties>::operator()
          (CheckIncompleteResult<vk::VkLayerProperties> *this,Context *context,
          ResultCollector *results,size_t expectedCompleteSize)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  long lVar4;
  deUint32 dVar5;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> outputData;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_70;
  ResultCollector *local_58;
  string local_50;
  
  if (expectedCompleteSize != 0) {
    local_58 = results;
    std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::vector
              (&local_70,expectedCompleteSize,(allocator_type *)&local_50);
    pVVar2 = local_70.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar1 = local_70.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (pVVar3 = local_70.
                  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
                  _M_impl.super__Vector_impl_data._M_start; pVVar3 < pVVar2; pVVar3 = pVVar3 + 1) {
      memset(pVVar3,0xde,0x208);
    }
    dVar5 = (deUint32)(expectedCompleteSize / 3);
    this->m_count = dVar5;
    this->m_result = VK_SUCCESS;
    (*this->_vptr_CheckIncompleteResult[2])(this,context,pVVar1);
    if ((this->m_count == dVar5) && (this->m_result == VK_INCOMPLETE)) {
      for (pVVar3 = local_70.
                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    (expectedCompleteSize / 3 & 0xffffffff);
          pVVar3 < local_70.
                   super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
        lVar4 = 0;
        do {
          if (pVVar3->layerName[lVar4] != -0x22) goto LAB_0041e803;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x208);
      }
    }
    else {
LAB_0041e803:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Query didn\'t return VK_INCOMPLETE","");
      tcu::ResultCollector::fail(local_58,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_70.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void operator() (Context& context, tcu::ResultCollector& results, const std::size_t expectedCompleteSize)
	{
		if (expectedCompleteSize == 0)
			return;

		vector<T>		outputData	(expectedCompleteSize);
		const deUint32	usedSize	= static_cast<deUint32>(expectedCompleteSize / 3);

		ValidateQueryBits::fillBits(outputData.begin(), outputData.end());	// unused entries should have this pattern intact
		m_count		= usedSize;
		m_result	= VK_SUCCESS;

		getResult(context, &outputData[0]);									// update m_count and m_result

		if (m_count != usedSize || m_result != VK_INCOMPLETE || !ValidateQueryBits::checkBits(outputData.begin() + m_count, outputData.end()))
			results.fail("Query didn't return VK_INCOMPLETE");
	}